

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>::Destroy
          (ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this,
          IMemoryAllocator *Allocator)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  IMemoryAllocator *Allocator_local;
  ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void> *this_local;
  
  if (this->m_pVariables != (void *)0x0) {
    msg.field_2._8_8_ = Allocator;
    if (this->m_pDbgAllocator != Allocator) {
      FormatString<char[74]>
                ((string *)local_38,
                 (char (*) [74])
                 "The allocator is not the same as the one that was used to allocate memory");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"Destroy",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x357);
      std::__cxx11::string::~string((string *)local_38);
    }
    (**(code **)(*(long *)msg.field_2._8_8_ + 8))(msg.field_2._8_8_,this->m_pVariables);
    this->m_pVariables = (void *)0x0;
  }
  this->m_pDbgAllocator = (IMemoryAllocator *)0x0;
  return;
}

Assistant:

void Destroy(IMemoryAllocator& Allocator)
    {
        if (m_pVariables != nullptr)
        {
            VERIFY(m_pDbgAllocator == &Allocator, "The allocator is not the same as the one that was used to allocate memory");
            Allocator.Free(m_pVariables);
            m_pVariables = nullptr;
        }
#ifdef DILIGENT_DEBUG
        m_pDbgAllocator = nullptr;
#endif
    }